

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O2

void VHASH_PADDED_32_but_hashing(void *key,int len,uint32_t seed,void *res)

{
  void *pvVar1;
  uchar *puVar2;
  
  if (((ulong)key & 0xf) == 0) {
    if ((len & 0xfU) != 0) {
      memcpy(vhi.aligned16Buff,(void *)((long)key + (long)((len / 0x80) * 0x80)),(long)(len % 0x80))
      ;
      memset(vhi.aligned16Buff + len % 0x80,0,(ulong)(0x10 - (len & 0xfU)));
    }
    *(undefined4 *)res = 0;
  }
  else {
    if (len < 0x100000) {
      pvVar1 = (void *)0x0;
      puVar2 = vhi.aligned16Buff;
    }
    else {
      pvVar1 = operator_new__((ulong)(len + 0x80));
      puVar2 = (uchar *)(((ulong)pvVar1 & 0xfffffffffffffff0) + 0x10);
    }
    memcpy(puVar2,key,(long)len);
    puVar2 = puVar2 + len;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    puVar2[8] = '\0';
    puVar2[9] = '\0';
    puVar2[10] = '\0';
    puVar2[0xb] = '\0';
    puVar2[0xc] = '\0';
    puVar2[0xd] = '\0';
    puVar2[0xe] = '\0';
    puVar2[0xf] = '\0';
    *(undefined4 *)res = 0;
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
      return;
    }
  }
  return;
}

Assistant:

void VHASH_PADDED_32_but_hashing(const void * key, int len, uint32_t seed, void * res)
{
	(void)seed; //unused
#ifdef __arm__
	if ((((uintptr_t)key) & 0xF) == 0) // aligned in memory
	{
#endif // __arm__
	if ((((uintptr_t)key) & 0xF) == 0) // aligned in memory
	{
		if (len & 0xF) // size is not a multiple of 16
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;
			int bytesRemaining = len - alignedLn;
			memcpy(vhi.aligned16Buff, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ((bytesRemaining >> 4) << 4) + 16;
			memset(vhi.aligned16Buff + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining);

			*(uint32_t*)res = 0;
		}
		else // size is a multiple of 16
		{
			*(uint32_t*)res = 0;
		}
	}
	else // unaligned data
	{
		unsigned char * buffAligned;
		unsigned char * buff = NULL;
		{
			if (len < VHASH_initializer::MAX_BUFF_LN)
				buffAligned = vhi.aligned16Buff;
			else
			{
				buff = new unsigned char[len + 128];
				buffAligned = (unsigned char*)((((size_t(buff)) >> 4) << 4) + 16);
			}
			memcpy(buffAligned, key, len);
			memset(buffAligned + len, 0, 16);
		}

		*(uint32_t*)res = 0;

		if (buff != NULL) delete[] buff;
	}
#ifdef __arm__
	}
	else // unaligned data
	{
		unsigned char * buffAligned;
		unsigned char * buff = NULL;
		{
			if ( len < VHASH_initializer::MAX_BUFF_LN )
				buffAligned = vhi.aligned16Buff;
			else
			{
				buff = new unsigned char[ len + 128 ];
				buffAligned = (unsigned char*)( ( ( ( size_t(buff) ) >> 4 ) << 4 )  + 16 );
			}
			memcpy( buffAligned, key, len );
			memset( buffAligned + len, 0, 16 );
		}
		if ( buff != NULL ) delete [] buff;
	}
#endif // __arm__
	//	vhash_abort(&(vhi.ctx));
}